

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

Inst * __thiscall mir::inst::LoadInst::deep_copy(LoadInst *this)

{
  Inst *pIVar1;
  Value *in_stack_ffffffffffffff98;
  Value *in_stack_ffffffffffffffa0;
  VarId local_48;
  VarId *in_stack_ffffffffffffffd0;
  Value *in_stack_ffffffffffffffd8;
  LoadInst *in_stack_ffffffffffffffe0;
  
  pIVar1 = (Inst *)operator_new(0x38);
  Value::Value(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  VarId::VarId(&local_48,(VarId *)in_stack_ffffffffffffff98);
  LoadInst(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return pIVar1;
}

Assistant:

Inst* deep_copy() { return new LoadInst(src, dest); }